

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O3

Gia_Man_t * Gia_ManFromBridgeReadBody(int Size,uchar *pBuffer,Vec_Int_t **pvInits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_01;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  byte *pbVar26;
  
  bVar9 = 0;
  bVar8 = 0;
  uVar14 = 0;
  bVar11 = *pBuffer;
  pbVar18 = pBuffer + 1;
  while ((char)bVar11 < '\0') {
    uVar14 = uVar14 | (bVar11 & 0x7f) << (bVar8 & 0x1f);
    bVar8 = bVar8 + 7;
    bVar11 = *pbVar18;
    pbVar18 = pbVar18 + 1;
  }
  uVar25 = (uint)*pbVar18;
  pbVar17 = pbVar18 + 1;
  if ((char)*pbVar18 < '\0') {
    bVar9 = 0;
    uVar22 = 0;
    do {
      uVar22 = uVar22 | (uVar25 & 0x7f) << (bVar9 & 0x1f);
      bVar10 = *pbVar17;
      uVar25 = (uint)bVar10;
      pbVar17 = pbVar17 + 1;
      bVar9 = bVar9 + 7;
    } while ((char)bVar10 < '\0');
  }
  else {
    uVar22 = 0;
  }
  uVar14 = (uint)bVar11 << (bVar8 & 0x1f) | uVar14;
  uVar22 = uVar25 << (bVar9 & 0x1f) | uVar22;
  uVar25 = (uint)*pbVar17;
  pbVar18 = pbVar17 + 1;
  bVar11 = 0;
  if ((char)*pbVar17 < '\0') {
    bVar11 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 | (uVar25 & 0x7f) << (bVar11 & 0x1f);
      bVar9 = *pbVar18;
      uVar25 = (uint)bVar9;
      pbVar18 = pbVar18 + 1;
      bVar11 = bVar11 + 7;
    } while ((char)bVar9 < '\0');
  }
  else {
    uVar2 = 0;
  }
  uVar2 = uVar25 << (bVar11 & 0x1f) | uVar2;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p->pArray = piVar4;
  Vec_IntPush(p,-999);
  Vec_IntPush(p,1);
  p_00 = Gia_ManStart(uVar14 + uVar22 * 2 + uVar2 + 2);
  pcVar5 = (char *)malloc(5);
  builtin_strncpy(pcVar5,"temp",5);
  p_00->pName = pcVar5;
  if (0 < (int)uVar14) {
    do {
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar24 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar24 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar24 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_001cc918;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_001cc918;
      Vec_IntPush(p,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * 0x55555556);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  uVar14 = uVar22;
  if (0 < (int)uVar22) {
    do {
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar24 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar24 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar24 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_001cc918;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_001cc918;
      Vec_IntPush(p,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * 0x55555556);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  if (0 < (int)uVar2) {
    uVar14 = 0;
    do {
      bVar11 = *pbVar18;
      bVar9 = 0;
      uVar25 = 0;
      while( true ) {
        pbVar18 = pbVar18 + 1;
        if (-1 < (char)bVar11) break;
        uVar25 = uVar25 | (bVar11 & 0x7f) << (bVar9 & 0x1f);
        bVar11 = *pbVar18;
        bVar9 = bVar9 + 7;
      }
      bVar8 = *pbVar18;
      uVar15 = (uint)bVar8;
      pbVar18 = pbVar18 + 1;
      bVar10 = 0;
      if ((char)bVar8 < '\0') {
        bVar10 = 0;
        uVar23 = 0;
        do {
          uVar23 = uVar23 | (uVar15 & 0x7f) << (bVar10 & 0x1f);
          bVar8 = *pbVar18;
          uVar15 = (uint)bVar8;
          pbVar18 = pbVar18 + 1;
          bVar10 = bVar10 + 7;
        } while ((char)bVar8 < '\0');
      }
      else {
        uVar23 = 0;
      }
      uVar25 = (uint)bVar11 << (bVar9 & 0x1f) | uVar25;
      if ((uVar25 & 1) != 0) {
        __assert_fail("!(iFan0 & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x15c,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      if (p->nSize <= (int)(uVar25 >> 2)) goto LAB_001cc956;
      uVar20 = p->pArray[uVar25 >> 2];
      if ((int)uVar20 < 0) goto LAB_001cc937;
      uVar23 = uVar15 << (bVar10 & 0x1f) | uVar23;
      uVar15 = uVar23 >> 1;
      if ((uint)p->nSize <= uVar15) goto LAB_001cc956;
      uVar15 = p->pArray[uVar15];
      if ((int)uVar15 < 0) goto LAB_001cc937;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar12 = uVar20 >> 1;
      uVar1 = p_00->nObjs;
      if ((int)uVar1 <= (int)uVar12) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar3 = uVar15 >> 1;
      if (uVar1 <= uVar3) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if ((uVar12 == uVar3) && (p_00->fGiaSimple == 0)) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar20 = uVar20 ^ uVar25 >> 1 & 1;
      uVar15 = uVar15 ^ uVar23 & 1;
      pGVar6 = p_00->pObjs;
      iVar16 = (int)pGVar7;
      if (uVar20 < uVar15) {
        if (pGVar6 + uVar1 <= pGVar7 || pGVar7 < pGVar6) goto LAB_001cc918;
        uVar24 = *(ulong *)pGVar7;
        uVar21 = (ulong)((uVar20 & 1) << 0x1d |
                        ((uint)(iVar16 - (int)pGVar6) >> 2) * -0x55555555 - uVar12 & 0x1fffffff);
        *(ulong *)pGVar7 = uVar21 | uVar24 & 0xffffffffc0000000;
        pGVar6 = p_00->pObjs;
        if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_001cc918;
        uVar13 = (ulong)(((uint)(iVar16 - (int)pGVar6) >> 2) * -0x55555555 - uVar3 & 0x1fffffff) <<
                 0x20;
        uVar21 = uVar21 | uVar24 & 0xc0000000c0000000;
        uVar24 = (ulong)(uVar15 & 1) << 0x3d;
      }
      else {
        if (pGVar6 + uVar1 <= pGVar7 || pGVar7 < pGVar6) {
LAB_001cc918:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar21 = (ulong)(((uint)(iVar16 - (int)pGVar6) >> 2) * -0x55555555 - uVar12 & 0x1fffffff) <<
                 0x20;
        uVar24 = *(ulong *)pGVar7;
        uVar19 = (ulong)(uVar20 & 1) << 0x3d;
        *(ulong *)pGVar7 = uVar19 | uVar24 & 0xc0000000ffffffff | uVar21;
        pGVar6 = p_00->pObjs;
        if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_001cc918;
        uVar13 = (ulong)(((uint)(iVar16 - (int)pGVar6) >> 2) * -0x55555555 - uVar3 & 0x1fffffff);
        uVar21 = uVar19 | uVar24 & 0xc0000000c0000000 | uVar21;
        uVar24 = (ulong)((uVar15 & 1) << 0x1d);
      }
      uVar13 = uVar24 | uVar21 | uVar13;
      *(ulong *)pGVar7 = uVar13;
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar7 + -(uVar13 & 0x1fffffff),pGVar7);
        Gia_ObjAddFanout(p_00,pGVar7 + -((ulong)*(uint *)&pGVar7->field_0x4 & 0x1fffffff),pGVar7);
      }
      if (p_00->fSweeper != 0) {
        uVar21 = *(ulong *)pGVar7 & 0x1fffffff;
        uVar24 = *(ulong *)pGVar7 >> 0x20 & 0x1fffffff;
        uVar19 = 0x4000000000000000;
        if (((uint)*(ulong *)(pGVar7 + -uVar21) >> 0x1e & 1) == 0) {
          uVar19 = 0x40000000;
        }
        *(ulong *)(pGVar7 + -uVar21) = uVar19 | *(ulong *)(pGVar7 + -uVar21);
        uVar19 = *(ulong *)(pGVar7 + -uVar24);
        uVar13 = 0x4000000000000000;
        if (((uint)uVar19 >> 0x1e & 1) == 0) {
          uVar13 = 0x40000000;
        }
        *(ulong *)(pGVar7 + -uVar24) = uVar13 | uVar19;
        uVar24 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 =
             uVar24 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar24 >> 0x3d) ^ (uint)(uVar19 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pGVar7 + -uVar21) >> 0x3f) ^
                    (uint)(uVar24 >> 0x1d) & 7)) << 0x3f;
      }
      if (p_00->fBuiltInSim != 0) {
        uVar24 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 =
             uVar24 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar24 >> 0x3d) ^
                     (uint)((ulong)*(undefined8 *)(pGVar7 + -(uVar24 >> 0x20 & 0x1fffffff)) >> 0x3f)
                     ) & ((uint)((ulong)*(undefined8 *)(pGVar7 + -(uVar24 & 0x1fffffff)) >> 0x3f) ^
                         (uint)(uVar24 >> 0x1d) & 7)) << 0x3f;
        pGVar6 = p_00->pObjs;
        if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_001cc918;
        Gia_ManBuiltInSimPerform
                  (p_00,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * -0x55555555);
      }
      if (p_00->vSuppWords != (Vec_Wrd_t *)0x0) {
        Gia_ManQuantSetSuppAnd(p_00,pGVar7);
      }
      pGVar6 = p_00->pObjs;
      if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_001cc918;
      Vec_IntPush(p,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * 0x55555556);
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar2);
  }
  pbVar17 = pbVar18;
  if (0 < (int)uVar22) {
    uVar14 = 0;
    do {
      bVar11 = *pbVar17;
      while (pbVar17 = pbVar17 + 1, (char)bVar11 < '\0') {
        bVar11 = *pbVar17;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar22);
  }
  uVar14 = (uint)*pbVar17;
  pbVar26 = pbVar17 + 1;
  bVar11 = 0;
  if ((char)*pbVar17 < '\0') {
    bVar11 = 0;
    uVar25 = 0;
    do {
      uVar25 = uVar25 | (uVar14 & 0x7f) << (bVar11 & 0x1f);
      bVar9 = *pbVar26;
      uVar14 = (uint)bVar9;
      pbVar26 = pbVar26 + 1;
      bVar11 = bVar11 + 7;
    } while ((char)bVar9 < '\0');
  }
  else {
    uVar25 = 0;
  }
  uVar25 = uVar14 << (bVar11 & 0x1f) | uVar25;
  if (0 < (int)uVar25) {
    iVar16 = p->nSize;
    uVar14 = 0;
    do {
      bVar11 = *pbVar26;
      bVar9 = 0;
      uVar2 = 0;
      while( true ) {
        pbVar26 = pbVar26 + 1;
        if (-1 < (char)bVar11) break;
        uVar2 = uVar2 | (bVar11 & 0x7f) << (bVar9 & 0x1f);
        bVar11 = *pbVar26;
        bVar9 = bVar9 + 7;
      }
      uVar2 = (uint)bVar11 << (bVar9 & 0x1f) | uVar2;
      uVar15 = uVar2 >> 1;
      if (iVar16 <= (int)uVar15) goto LAB_001cc956;
      if (p->pArray[uVar15] < 0) goto LAB_001cc937;
      Gia_ManAppendCo(p_00,uVar2 & 1 ^ p->pArray[uVar15] ^ 1);
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar25);
  }
  uVar14 = (uint)*pbVar26;
  pbVar17 = pbVar26 + 1;
  bVar11 = 0;
  if ((char)*pbVar26 < '\0') {
    bVar11 = 0;
    uVar25 = 0;
    do {
      uVar25 = uVar25 | (uVar14 & 0x7f) << (bVar11 & 0x1f);
      bVar9 = *pbVar17;
      uVar14 = (uint)bVar9;
      pbVar17 = pbVar17 + 1;
      bVar11 = bVar11 + 7;
    } while ((char)bVar9 < '\0');
  }
  else {
    uVar25 = 0;
  }
  if ((uVar14 << (bVar11 & 0x1f) | uVar25) != 1) {
    __assert_fail("verFairness == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x17b,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  uVar14 = (uint)*pbVar17;
  pbVar26 = pbVar17 + 1;
  bVar11 = 0;
  if ((char)*pbVar17 < '\0') {
    bVar11 = 0;
    uVar25 = 0;
    do {
      uVar25 = uVar25 | (uVar14 & 0x7f) << (bVar11 & 0x1f);
      bVar9 = *pbVar26;
      uVar14 = (uint)bVar9;
      pbVar26 = pbVar26 + 1;
      bVar11 = bVar11 + 7;
    } while ((char)bVar9 < '\0');
  }
  else {
    uVar25 = 0;
  }
  if (uVar14 << (bVar11 & 0x1f) != 0 || uVar25 != 0) {
    __assert_fail("nFairness == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x17e,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  uVar14 = (uint)*pbVar26;
  pbVar17 = pbVar26 + 1;
  bVar11 = 0;
  if ((char)*pbVar26 < '\0') {
    bVar11 = 0;
    uVar25 = 0;
    do {
      uVar25 = uVar25 | (uVar14 & 0x7f) << (bVar11 & 0x1f);
      bVar9 = *pbVar17;
      uVar14 = (uint)bVar9;
      pbVar17 = pbVar17 + 1;
      bVar11 = bVar11 + 7;
    } while ((char)bVar9 < '\0');
  }
  else {
    uVar25 = 0;
  }
  if (uVar14 << (bVar11 & 0x1f) != 0 || uVar25 != 0) {
    __assert_fail("nConstraints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x181,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  if (pBuffer + Size != pbVar17) {
    __assert_fail("pBufferEnd == pBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x184,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar22 - 1) {
    uVar14 = uVar22;
  }
  p_01->nSize = 0;
  p_01->nCap = uVar14;
  if (uVar14 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar14 << 2);
  }
  p_01->pArray = piVar4;
  if (0 < (int)uVar22) {
    uVar14 = 0;
    do {
      bVar11 = *pbVar18;
      bVar9 = 0;
      uVar25 = 0;
      while( true ) {
        pbVar18 = pbVar18 + 1;
        if (-1 < (char)bVar11) break;
        uVar25 = uVar25 | (bVar11 & 0x7f) << (bVar9 & 0x1f);
        bVar11 = *pbVar18;
        bVar9 = bVar9 + 7;
      }
      uVar25 = (uint)bVar11 << (bVar9 & 0x1f) | uVar25;
      if ((uVar25 & 3) != 2) {
        __assert_fail("(iFan0 & 3) == BRIDGE_VALUE_0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x18c,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      Vec_IntPush(p_01,2);
      if (p->nSize <= (int)(uVar25 >> 3)) {
LAB_001cc956:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pArray[uVar25 >> 3] < 0) {
LAB_001cc937:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,p->pArray[uVar25 >> 3] ^ uVar25 >> 2 & 1);
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar22);
  }
  Gia_ManSetRegNum(p_00,uVar22);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (pvInits == (Vec_Int_t **)0x0) {
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
    }
    free(p_01);
  }
  else {
    *pvInits = p_01;
  }
  return p_00;
}

Assistant:

Gia_Man_t *  Gia_ManFromBridgeReadBody( int Size, unsigned char * pBuffer, Vec_Int_t ** pvInits )
{
    int fHash = 0;
    Vec_Int_t * vLits, * vInits;
    Gia_Man_t * p = NULL;
    unsigned char * pBufferPivot, * pBufferEnd = pBuffer + Size;
    int i, nInputs, nFlops, nGates, nProps;
    int verFairness, nFairness, nConstraints;
    unsigned iFan0, iFan1;

    nInputs = Gia_AigerReadUnsigned( &pBuffer );
    nFlops  = Gia_AigerReadUnsigned( &pBuffer );
    nGates  = Gia_AigerReadUnsigned( &pBuffer );

    vLits = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLits, -999 );
    Vec_IntPush( vLits,  1 );

    // start the AIG package
    p = Gia_ManStart( nInputs + nFlops * 2 + nGates + 1 + 1 ); // PI+FO+FI+AND+PO+1
    p->pName = Abc_UtilStrsav( "temp" );

    // create PIs
    for ( i = 0; i < nInputs; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create flop outputs
    for ( i = 0; i < nFlops; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create nodes
    if ( fHash )
        Gia_ManHashAlloc( p );
    for ( i = 0; i < nGates; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan1 = Gia_AigerReadUnsigned( &pBuffer );
        assert( !(iFan0 & 1) );
        iFan0 >>= 1;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        iFan1 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan1 >> 1), iFan1 & 1 );
        if ( fHash )
            Vec_IntPush( vLits, Gia_ManHashAnd(p, iFan0, iFan1) );
        else
            Vec_IntPush( vLits, Gia_ManAppendAnd(p, iFan0, iFan1) );

    }
    if ( fHash )
        Gia_ManHashStop( p );

    // remember where flops begin
    pBufferPivot = pBuffer;
    // scroll through flops
    for ( i = 0; i < nFlops; i++ )
        Gia_AigerReadUnsigned( &pBuffer );

    // create POs
    nProps = Gia_AigerReadUnsigned( &pBuffer );
//    assert( nProps == 1 );
    for ( i = 0; i < nProps; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        // complement property output!!!
        Gia_ManAppendCo( p, Abc_LitNot(iFan0) );
    }

    verFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( verFairness == 1 );

    nFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( nFairness == 0 );

    nConstraints = Gia_AigerReadUnsigned( &pBuffer );
    assert( nConstraints == 0);

    // make sure the end of buffer is reached
    assert( pBufferEnd == pBuffer );

    // resetting to flops
    pBuffer = pBufferPivot;
    vInits = Vec_IntAlloc( nFlops );
    for ( i = 0; i < nFlops; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        assert( (iFan0 & 3) == BRIDGE_VALUE_0 );
        Vec_IntPush( vInits, iFan0 & 3 ); // 0 = X value; 1 = not used; 2 = false; 3 = true
        iFan0 >>= 2;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        Gia_ManAppendCo( p, iFan0 );
    }
    Gia_ManSetRegNum( p, nFlops );
    Vec_IntFree( vLits );

    // remove wholes in the node list
    if ( fHash )
    {
        Gia_Man_t * pTemp;
        p = Gia_ManCleanup( pTemp = p );
        Gia_ManStop( pTemp );
    }

    // return
    if ( pvInits )
        *pvInits = vInits;
    else
        Vec_IntFree( vInits );
    return p;
}